

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int jx9Builtin_implode(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  int iVar1;
  int local_64;
  char *pcStack_60;
  int nLen;
  char *zData;
  jx9_context *pjStack_50;
  int i;
  implode_data imp_data;
  jx9_value **apArg_local;
  int nArg_local;
  jx9_context *pCtx_local;
  
  zData._4_4_ = 1;
  imp_data._32_8_ = apArg;
  if (nArg < 1) {
    jx9_result_null(pCtx);
  }
  else {
    imp_data.pCtx._0_4_ = 0;
    imp_data.zSep._4_4_ = 1;
    imp_data.nSeplen = 0;
    pjStack_50 = pCtx;
    iVar1 = jx9_value_is_json_array(*apArg);
    if (iVar1 == 0) {
      imp_data._8_8_ = jx9_value_to_string(*(jx9_value **)imp_data._32_8_,(int *)&imp_data.zSep);
    }
    else {
      imp_data.bRecursive = 0;
      imp_data._12_4_ = 0;
      imp_data.zSep._0_4_ = 0;
      zData._4_4_ = 0;
    }
    jx9_result_string(pCtx,"",0);
    for (; zData._4_4_ < nArg; zData._4_4_ = zData._4_4_ + 1) {
      iVar1 = jx9_value_is_json_array(*(jx9_value **)(imp_data._32_8_ + (long)zData._4_4_ * 8));
      if (iVar1 == 0) {
        pcStack_60 = jx9_value_to_string(*(jx9_value **)(imp_data._32_8_ + (long)zData._4_4_ * 8),
                                         &local_64);
        if (0 < local_64) {
          if (0 < (int)imp_data.zSep) {
            if (imp_data.zSep._4_4_ == 0) {
              jx9_result_string(pCtx,(char *)imp_data._8_8_,(int)imp_data.zSep);
            }
            else {
              imp_data.zSep._4_4_ = 0;
            }
          }
          jx9_result_string(pCtx,pcStack_60,local_64);
        }
      }
      else {
        jx9_array_walk(*(jx9_value **)(imp_data._32_8_ + (long)zData._4_4_ * 8),implode_callback,
                       &stack0xffffffffffffffb0);
      }
    }
  }
  return 0;
}

Assistant:

static int jx9Builtin_implode(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	struct implode_data imp_data;
	int i = 1;
	if( nArg < 1 ){
		/* Missing argument, return NULL */
		jx9_result_null(pCtx);
		return JX9_OK;
	}
	/* Prepare the implode context */
	imp_data.pCtx = pCtx;
	imp_data.bRecursive = 0;
	imp_data.bFirst = 1;
	imp_data.nRecCount = 0;
	if( !jx9_value_is_json_array(apArg[0]) ){
		imp_data.zSep = jx9_value_to_string(apArg[0], &imp_data.nSeplen);
	}else{
		imp_data.zSep = 0;
		imp_data.nSeplen = 0;
		i = 0;
	}
	jx9_result_string(pCtx, "", 0); /* Set an empty stirng */
	/* Start the 'join' process */
	while( i < nArg ){
		if( jx9_value_is_json_array(apArg[i]) ){
			/* Iterate throw array entries */
			jx9_array_walk(apArg[i], implode_callback, &imp_data);
		}else{
			const char *zData;
			int nLen;
			/* Extract the string representation of the jx9 value */
			zData = jx9_value_to_string(apArg[i], &nLen);
			if( nLen > 0 ){
				if( imp_data.nSeplen > 0 ){
					if( !imp_data.bFirst ){
						/* append the separator first */
						jx9_result_string(pCtx, imp_data.zSep, imp_data.nSeplen);
					}else{
						imp_data.bFirst = 0;
					}
				}
				jx9_result_string(pCtx, zData, nLen);
			}
		}
		i++;
	}
	return JX9_OK;
}